

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::ClearPartialCollect(Recycler *this)

{
  undefined4 *puVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  Type buffer;
  undefined8 *in_FS_OFFSET;
  
  bVar4 = DoQueueTrackedObject(this);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x10a1,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  (this->autoHeap).unusedPartialCollectFreeBytes = 0;
  this->partialUncollectedAllocBytes = 0;
  buffer = (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next;
  while ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)buffer !=
         &this->clientTrackedObjectList) {
    pSVar2 = buffer->next;
    ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&(this->clientTrackedObjectAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,0x10
              );
    buffer = pSVar2;
  }
  (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->clientTrackedObjectList).super_RealCount.count = 0;
  this->uncollectedNewPageCountPartialCollect = 0xffffffffffffffff;
  return;
}

Assistant:

void
Recycler::ClearPartialCollect()
{
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif
    this->autoHeap.unusedPartialCollectFreeBytes = 0;
    this->partialUncollectedAllocBytes = 0;
    this->clientTrackedObjectList.Clear(&this->clientTrackedObjectAllocator);
    this->uncollectedNewPageCountPartialCollect = (size_t)-1;
}